

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

CKeyID * GetKeyForDestination
                   (CKeyID *__return_storage_ptr__,SigningProvider *store,CTxDestination *dest)

{
  uint160 *puVar1;
  base_blob<160U> *pbVar2;
  __index_type _Var3;
  bool bVar4;
  int iVar5;
  long in_FS_OFFSET;
  CScript script;
  CTxDestination inner_dest;
  CScriptID script_id;
  undefined1 local_f8 [80];
  undefined1 local_a8 [64];
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  local_68;
  CScriptID local_34;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3 = (dest->
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ).
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_index;
  if (_Var3 == '\x05') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      ToKeyID(__return_storage_ptr__,(WitnessV0KeyHash *)dest);
      return __return_storage_ptr__;
    }
    goto LAB_005fad6d;
  }
  if (_Var3 == '\x03') {
    local_f8._16_8_ = 0;
    local_f8._24_8_ = 0;
    local_f8._0_8_ = (char *)0x0;
    local_f8._8_8_ = 0;
    ToScriptID(&local_34,(ScriptHash *)dest);
    local_a8._16_8_ = 0;
    local_a8._24_8_ = 0;
    local_a8._0_8_ = 0;
    local_a8._8_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color =
         local_68._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    iVar5 = (*store->_vptr_SigningProvider[2])(store,&local_34,local_f8);
    if ((char)iVar5 == '\0') {
LAB_005fac29:
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)local_a8);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_f8);
      _Var3 = (dest->
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ).
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_index;
      goto LAB_005fac3f;
    }
    bVar4 = ExtractDestination((CScript *)local_f8,(CTxDestination *)local_a8);
    if (!bVar4 || (undefined1)local_68._M_impl.super__Rb_tree_header._M_header._M_color != 5)
    goto LAB_005fac29;
    ToKeyID(__return_storage_ptr__,(WitnessV0KeyHash *)local_a8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_a8);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_f8);
  }
  else {
    if (_Var3 == '\x02') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        ToKeyID(__return_storage_ptr__,(PKHash *)dest);
        return __return_storage_ptr__;
      }
      goto LAB_005fad6d;
    }
LAB_005fac3f:
    if (_Var3 == '\x06') {
      local_68._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_68._M_impl.super__Rb_tree_header._M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._0_8_ = 0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = 0;
      local_a8._24_8_ = 0;
      local_a8._32_8_ = 0;
      local_a8._40_8_ = 0;
      local_a8._48_8_ = 0;
      local_a8._56_8_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f8[0] = 0xff;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = (*store->_vptr_SigningProvider[8])(store,dest,local_a8);
      if (((((char)iVar5 != '\0') &&
           (bVar4 = base_blob<256U>::IsNull((base_blob<256U> *)local_a8), !bVar4)) &&
          (bVar4 = base_blob<256U>::IsNull((base_blob<256U> *)(local_a8 + 0x20)), bVar4)) &&
         (bVar4 = SigningProvider::GetPubKeyByXOnly
                            (store,(XOnlyPubKey *)local_a8,(CPubKey *)local_f8), bVar4)) {
        CPubKey::GetID(__return_storage_ptr__,(CPubKey *)local_f8);
        std::
        _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_68);
        goto LAB_005facf1;
      }
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_68);
    }
    puVar1 = &__return_storage_ptr__->super_uint160;
    (puVar1->super_base_blob<160U>).m_data._M_elems[0] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[1] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[2] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[3] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[4] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[5] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[6] = '\0';
    (puVar1->super_base_blob<160U>).m_data._M_elems[7] = '\0';
    pbVar2 = &(__return_storage_ptr__->super_uint160).super_base_blob<160U>;
    (pbVar2->m_data)._M_elems[8] = '\0';
    (pbVar2->m_data)._M_elems[9] = '\0';
    (pbVar2->m_data)._M_elems[10] = '\0';
    (pbVar2->m_data)._M_elems[0xb] = '\0';
    (pbVar2->m_data)._M_elems[0xc] = '\0';
    (pbVar2->m_data)._M_elems[0xd] = '\0';
    (pbVar2->m_data)._M_elems[0xe] = '\0';
    (pbVar2->m_data)._M_elems[0xf] = '\0';
    pbVar2 = &(__return_storage_ptr__->super_uint160).super_base_blob<160U>;
    (pbVar2->m_data)._M_elems[0x10] = '\0';
    (pbVar2->m_data)._M_elems[0x11] = '\0';
    (pbVar2->m_data)._M_elems[0x12] = '\0';
    (pbVar2->m_data)._M_elems[0x13] = '\0';
  }
LAB_005facf1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_005fad6d:
  __stack_chk_fail();
}

Assistant:

CKeyID GetKeyForDestination(const SigningProvider& store, const CTxDestination& dest)
{
    // Only supports destinations which map to single public keys:
    // P2PKH, P2WPKH, P2SH-P2WPKH, P2TR
    if (auto id = std::get_if<PKHash>(&dest)) {
        return ToKeyID(*id);
    }
    if (auto witness_id = std::get_if<WitnessV0KeyHash>(&dest)) {
        return ToKeyID(*witness_id);
    }
    if (auto script_hash = std::get_if<ScriptHash>(&dest)) {
        CScript script;
        CScriptID script_id = ToScriptID(*script_hash);
        CTxDestination inner_dest;
        if (store.GetCScript(script_id, script) && ExtractDestination(script, inner_dest)) {
            if (auto inner_witness_id = std::get_if<WitnessV0KeyHash>(&inner_dest)) {
                return ToKeyID(*inner_witness_id);
            }
        }
    }
    if (auto output_key = std::get_if<WitnessV1Taproot>(&dest)) {
        TaprootSpendData spenddata;
        CPubKey pub;
        if (store.GetTaprootSpendData(*output_key, spenddata)
            && !spenddata.internal_key.IsNull()
            && spenddata.merkle_root.IsNull()
            && store.GetPubKeyByXOnly(spenddata.internal_key, pub)) {
            return pub.GetID();
        }
    }
    return CKeyID();
}